

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O1

int ixmlNamedNodeMap_addToNamedNodeMap(IXML_NamedNodeMap **nnMap,IXML_Node *add)

{
  IXML_NamedNodeMap *pIVar1;
  IXML_NamedNodeMap *pIVar2;
  _IXML_NamedNodeMap *p_Var3;
  
  if (add == (IXML_Node *)0x0) {
    return 0;
  }
  if (*nnMap == (IXML_NamedNodeMap *)0x0) {
    pIVar1 = (IXML_NamedNodeMap *)malloc(0x10);
    *nnMap = pIVar1;
    if (pIVar1 == (IXML_NamedNodeMap *)0x0) {
      return 0x66;
    }
    pIVar1->nodeItem = (IXML_Node *)0x0;
    pIVar1->next = (_IXML_NamedNodeMap *)0x0;
  }
  pIVar1 = *nnMap;
  if (pIVar1->nodeItem != (IXML_Node *)0x0) {
    do {
      pIVar2 = pIVar1;
      pIVar1 = pIVar2->next;
    } while (pIVar1 != (_IXML_NamedNodeMap *)0x0);
    p_Var3 = (_IXML_NamedNodeMap *)malloc(0x10);
    if (p_Var3 == (_IXML_NamedNodeMap *)0x0) {
      return 0x66;
    }
    pIVar2->next = p_Var3;
    p_Var3->nodeItem = add;
    p_Var3->next = (_IXML_NamedNodeMap *)0x0;
    return 0;
  }
  pIVar1->nodeItem = add;
  return 0;
}

Assistant:

int ixmlNamedNodeMap_addToNamedNodeMap(
	IXML_NamedNodeMap **nnMap, IXML_Node *add)
{
	IXML_NamedNodeMap *traverse = NULL;
	IXML_NamedNodeMap *p = NULL;
	IXML_NamedNodeMap *newItem = NULL;

	if (add == NULL) {
		return IXML_SUCCESS;
	}

	if (*nnMap == NULL) {
		/* nodelist is empty */
		*nnMap = (IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (*nnMap == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		ixmlNamedNodeMap_init(*nnMap);
	}
	if ((*nnMap)->nodeItem == NULL) {
		(*nnMap)->nodeItem = add;
	} else {
		traverse = *nnMap;
		p = traverse;
		while (traverse != NULL) {
			p = traverse;
			traverse = traverse->next;
		}
		newItem =
			(IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (newItem == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		p->next = newItem;
		newItem->nodeItem = add;
		newItem->next = NULL;
	}

	return IXML_SUCCESS;
}